

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandPermute(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_54;
  uint local_50;
  uint local_4c;
  char *local_48;
  
  pAVar4 = pAbc->pNtkCur;
  local_48 = (char *)0x0;
  Extra_UtilGetoptReset();
  local_54 = 1;
  local_50 = 1;
  local_4c = 1;
  bVar1 = true;
  bVar2 = false;
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"Fiofnxh"), iVar3 == 0x78) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    switch(iVar3) {
    case 0x66:
      local_4c = local_4c ^ 1;
      break;
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
switchD_0021c9f8_caseD_67:
      pcVar5 = "Unknown switch.\n";
      iVar3 = -2;
      goto LAB_0021ca53;
    case 0x68:
      goto switchD_0021c9f8_caseD_68;
    case 0x69:
      local_54 = local_54 ^ 1;
      break;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x6f:
      local_50 = local_50 ^ 1;
      break;
    default:
      if (iVar3 == -1) {
        if (pAVar4 == (Abc_Ntk_t *)0x0) {
          pcVar5 = "Empty network.\n";
        }
        else if (bVar2) {
          if (pAVar4->nObjCounts[8] == 0) {
            Abc_NtkPermutePiUsingFanout(pAVar4);
            return 0;
          }
          pcVar5 = "Currently \"permute -x\" works only for combinational networks.\n";
        }
        else {
          if (bVar1) {
            if (pAVar4->ntkType != ABC_NTK_STRASH) {
              pcVar5 = "To permute nodes, the network should be structurally hashed.\n";
              goto LAB_0021cb6b;
            }
            pAVar4 = Abc_NtkRestrashRandom(pAVar4);
          }
          else {
            pAVar4 = Abc_NtkDup(pAVar4);
          }
          if (pAVar4 != (Abc_Ntk_t *)0x0) {
            Abc_NtkPermute(pAVar4,local_54,local_50,local_4c,local_48);
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar4);
            return 0;
          }
          pcVar5 = "Command \"permute\" has failed.\n";
        }
LAB_0021cb6b:
        iVar3 = -1;
        goto LAB_0021cb70;
      }
      if (iVar3 != 0x46) goto switchD_0021c9f8_caseD_67;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-F\" should be followed by a file name.\n";
        iVar3 = -1;
LAB_0021ca53:
        Abc_Print(iVar3,pcVar5);
switchD_0021c9f8_caseD_68:
        Abc_Print(-2,"usage: permute [-iofnxh] [-F filename]\n");
        Abc_Print(-2,"\t                performs random permutation of inputs/outputs/flops\n");
        pcVar6 = "yes";
        pcVar5 = "yes";
        if (local_54 == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-i            : toggle permuting primary inputs [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (local_50 == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-o            : toggle permuting primary outputs [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (local_4c == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-f            : toggle permuting flip-flops [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-n            : toggle deriving new topological ordering of nodes [default = %s]\n"
                  ,pcVar5);
        if (!bVar2) {
          pcVar6 = "no";
        }
        Abc_Print(-2,
                  "\t-x            : toggle permuting inputs based on their fanout count [default = %s]\n"
                  ,pcVar6);
        Abc_Print(-2,"\t-h            : print the command usage\n");
        pcVar5 = "\t-F <filename> : (optional) file with the flop permutation\n";
        iVar3 = -2;
LAB_0021cb70:
        Abc_Print(iVar3,pcVar5);
        return 1;
      }
      local_48 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandPermute( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkRestrashRandom( Abc_Ntk_t * pNtk );
    extern void Abc_NtkPermutePiUsingFanout( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = pAbc->pNtkCur, * pNtkRes = NULL;
    char * pFlopPermFile = NULL;
    int fInputs = 1;
    int fOutputs = 1;
    int fFlops = 1;
    int fNodes = 1;
    int fFanout = 0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fiofnxh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a file name.\n" );
                goto usage;
            }
            pFlopPermFile = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'i':
            fInputs ^= 1;
            break;
        case 'o':
            fOutputs ^= 1;
            break;
        case 'f':
            fFlops ^= 1;
            break;
        case 'n':
            fNodes ^= 1;
            break;
        case 'x':
            fFanout ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( fFanout )
    {
        if ( Abc_NtkLatchNum(pNtk) )
        {
            Abc_Print( -1, "Currently \"permute -x\" works only for combinational networks.\n" );
            return 1;
        }
        Abc_NtkPermutePiUsingFanout( pNtk );
        return 0;
    }
    if ( fNodes && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "To permute nodes, the network should be structurally hashed.\n" );
        return 1;
    }
    if ( fNodes )
        pNtkRes = Abc_NtkRestrashRandom( pNtk );
    else
        pNtkRes = Abc_NtkDup( pNtk );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command \"permute\" has failed.\n" );
        return 1;
    }
    Abc_NtkPermute( pNtkRes, fInputs, fOutputs, fFlops, pFlopPermFile );
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: permute [-iofnxh] [-F filename]\n" );
    Abc_Print( -2, "\t                performs random permutation of inputs/outputs/flops\n" );
    Abc_Print( -2, "\t-i            : toggle permuting primary inputs [default = %s]\n", fInputs? "yes": "no" );
    Abc_Print( -2, "\t-o            : toggle permuting primary outputs [default = %s]\n", fOutputs? "yes": "no" );
    Abc_Print( -2, "\t-f            : toggle permuting flip-flops [default = %s]\n", fFlops? "yes": "no" );
    Abc_Print( -2, "\t-n            : toggle deriving new topological ordering of nodes [default = %s]\n", fNodes? "yes": "no" );
    Abc_Print( -2, "\t-x            : toggle permuting inputs based on their fanout count [default = %s]\n", fFanout? "yes": "no" );
    Abc_Print( -2, "\t-h            : print the command usage\n");
    Abc_Print( -2, "\t-F <filename> : (optional) file with the flop permutation\n" );
    return 1;
}